

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cheaptrick.cpp
# Opt level: O2

void CheapTrick(double *x,int x_length,int fs,double *temporal_positions,double *f0,int f0_length,
               CheapTrickOption *option,double **spectrogram)

{
  uint uVar1;
  int fft_size;
  double dVar2;
  double dVar3;
  double dVar4;
  double f0_00;
  int i_2;
  int iVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  undefined8 *puVar11;
  double *pdVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  double *pdVar16;
  ulong uVar17;
  fft_plan *pfVar18;
  ulong uVar19;
  undefined8 *puVar20;
  ulong uVar21;
  int i_1;
  long lVar22;
  int i;
  ulong uVar23;
  byte bVar24;
  ulong uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  fft_plan in_stack_fffffffffffffdd8;
  RandnState randn_state;
  ForwardRealFFT forward_real_fft;
  InverseRealFFT inverse_real_fft;
  
  bVar24 = 0;
  fft_size = option->fft_size;
  lVar22 = (long)fft_size;
  randn_state.g_randn_x = 0;
  randn_state.g_randn_y = 0;
  randn_state.g_randn_z = 0;
  randn_state.g_randn_w = 0;
  randn_reseed(&randn_state);
  dVar2 = (double)fs;
  uVar19 = lVar22 * 8;
  if (lVar22 < 0) {
    uVar19 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar19);
  forward_real_fft.forward_fft.ip = (int *)0x0;
  forward_real_fft.forward_fft.w = (double *)0x0;
  forward_real_fft.forward_fft.out = (double *)0x0;
  forward_real_fft.forward_fft.input = (double *)0x0;
  forward_real_fft.forward_fft.in = (double *)0x0;
  forward_real_fft.forward_fft.c_out = (fft_complex *)0x0;
  forward_real_fft.forward_fft.flags = 0;
  forward_real_fft.forward_fft._12_4_ = 0;
  forward_real_fft.forward_fft.c_in = (fft_complex *)0x0;
  forward_real_fft.spectrum = (fft_complex *)0x0;
  forward_real_fft.forward_fft.n = 0;
  forward_real_fft.forward_fft.sign = 0;
  forward_real_fft.fft_size = 0;
  forward_real_fft._4_4_ = 0;
  forward_real_fft.waveform = (double *)0x0;
  InitializeForwardRealFFT(fft_size,&forward_real_fft);
  inverse_real_fft.inverse_fft.ip = (int *)0x0;
  inverse_real_fft.inverse_fft.w = (double *)0x0;
  inverse_real_fft.inverse_fft.out = (double *)0x0;
  inverse_real_fft.inverse_fft.input = (double *)0x0;
  inverse_real_fft.inverse_fft.in = (double *)0x0;
  inverse_real_fft.inverse_fft.c_out = (fft_complex *)0x0;
  inverse_real_fft.inverse_fft.flags = 0;
  inverse_real_fft.inverse_fft._12_4_ = 0;
  inverse_real_fft.inverse_fft.c_in = (fft_complex *)0x0;
  inverse_real_fft.spectrum = (fft_complex *)0x0;
  inverse_real_fft.inverse_fft.n = 0;
  inverse_real_fft.inverse_fft.sign = 0;
  inverse_real_fft.fft_size = 0;
  inverse_real_fft._4_4_ = 0;
  inverse_real_fft.waveform = (double *)0x0;
  InitializeInverseRealFFT(fft_size,&inverse_real_fft);
  iVar5 = fft_size / 2;
  iVar6 = -1;
  if (-1 < iVar5) {
    iVar6 = iVar5;
  }
  uVar13 = (ulong)(iVar6 + 1);
  uVar17 = (ulong)iVar5;
  uVar23 = 0xffffffffffffffff;
  if (-1 < (long)uVar17) {
    uVar23 = uVar17;
  }
  if (f0_length < 1) {
    f0_length = 0;
  }
  for (uVar21 = 0; uVar21 != (uint)f0_length; uVar21 = uVar21 + 1) {
    uVar25 = -(ulong)((dVar2 * 3.0) / ((double)fft_size + -3.0) < f0[uVar21]);
    f0_00 = (double)(~uVar25 & 0x407f400000000000 | (ulong)f0[uVar21] & uVar25);
    dVar26 = temporal_positions[uVar21];
    dVar28 = option->q1;
    dVar3 = (dVar2 * 1.5) / f0_00;
    iVar6 = matlab_round(dVar3);
    uVar1 = iVar6 * 2 + 1;
    uVar15 = (long)(int)uVar1 << 3;
    uVar25 = (long)(int)uVar1 * 4;
    if (iVar6 < 0) {
      uVar15 = 0xffffffffffffffff;
      uVar25 = 0xffffffffffffffff;
    }
    pvVar8 = operator_new__(uVar25);
    pvVar9 = operator_new__(uVar25);
    pvVar10 = operator_new__(uVar15);
    for (lVar14 = (long)-iVar6; lVar14 <= iVar6; lVar14 = lVar14 + 1) {
      *(int *)((long)pvVar8 + lVar14 * 4 + (long)iVar6 * 4) = (int)lVar14;
    }
    iVar6 = matlab_round(dVar26 * dVar2 + 0.001);
    uVar25 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar25 = 0;
    }
    for (uVar15 = 0; uVar25 != uVar15; uVar15 = uVar15 + 1) {
      iVar5 = *(int *)((long)pvVar8 + uVar15 * 4) + iVar6;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      if (x_length + -1 < iVar5) {
        iVar5 = x_length + -1;
      }
      *(int *)((long)pvVar9 + uVar15 * 4) = iVar5;
    }
    dVar26 = 0.0;
    for (uVar15 = 0; uVar25 != uVar15; uVar15 = uVar15 + 1) {
      dVar27 = cos((((double)*(int *)((long)pvVar8 + uVar15 * 4) / 1.5) / dVar2) * 3.141592653589793
                   * f0_00);
      dVar27 = dVar27 * 0.5 + 0.5;
      *(double *)((long)pvVar10 + uVar15 * 8) = dVar27;
      dVar26 = dVar26 + dVar27 * dVar27;
    }
    if (dVar26 < 0.0) {
      dVar26 = sqrt(dVar26);
    }
    else {
      dVar26 = SQRT(dVar26);
    }
    pdVar12 = forward_real_fft.waveform;
    for (uVar15 = 0; uVar25 != uVar15; uVar15 = uVar15 + 1) {
      *(double *)((long)pvVar10 + uVar15 * 8) = *(double *)((long)pvVar10 + uVar15 * 8) / dVar26;
    }
    for (uVar15 = 0; uVar25 != uVar15; uVar15 = uVar15 + 1) {
      dVar26 = x[*(int *)((long)pvVar9 + uVar15 * 4)];
      dVar27 = *(double *)((long)pvVar10 + uVar15 * 8);
      dVar4 = randn(&randn_state);
      pdVar12[uVar15] = dVar4 * 1e-12 + dVar26 * dVar27;
    }
    dVar26 = 0.0;
    dVar27 = 0.0;
    for (uVar15 = 0; uVar25 != uVar15; uVar15 = uVar15 + 1) {
      dVar26 = dVar26 + pdVar12[uVar15];
      dVar27 = dVar27 + *(double *)((long)pvVar10 + uVar15 * 8);
    }
    for (uVar15 = 0; uVar25 != uVar15; uVar15 = uVar15 + 1) {
      pdVar12[uVar15] =
           pdVar12[uVar15] - *(double *)((long)pvVar10 + uVar15 * 8) * (dVar26 / dVar27);
    }
    operator_delete__(pvVar8);
    operator_delete__(pvVar9);
    operator_delete__(pvVar10);
    iVar6 = matlab_round(dVar3);
    for (lVar14 = (long)(iVar6 * 2 + 1); lVar14 < lVar22; lVar14 = lVar14 + 1) {
      forward_real_fft.waveform[lVar14] = 0.0;
    }
    pfVar18 = &forward_real_fft.forward_fft;
    puVar11 = (undefined8 *)&stack0xfffffffffffffdd8;
    for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar11 = *(undefined8 *)pfVar18;
      pfVar18 = (fft_plan *)((long)pfVar18 + (ulong)bVar24 * -0x10 + 8);
      puVar11 = puVar11 + (ulong)bVar24 * -2 + 1;
    }
    fft_execute(in_stack_fffffffffffffdd8);
    for (lVar14 = 0; uVar13 * 8 != lVar14; lVar14 = lVar14 + 8) {
      dVar26 = *(double *)((long)*forward_real_fft.spectrum + lVar14 * 2);
      dVar3 = *(double *)((long)*forward_real_fft.spectrum + lVar14 * 2 + 8);
      *(double *)((long)forward_real_fft.waveform + lVar14) = dVar26 * dVar26 + dVar3 * dVar3;
    }
    DCCorrection(forward_real_fft.waveform,f0_00,fs,fft_size,forward_real_fft.waveform);
    LinearSmoothing(forward_real_fft.waveform,(f0_00 + f0_00) / 3.0,fs,fft_size,
                    forward_real_fft.waveform);
    pdVar12 = forward_real_fft.waveform;
    for (lVar14 = 0; uVar23 + 1 != lVar14; lVar14 = lVar14 + 1) {
      dVar26 = pdVar12[lVar14];
      dVar3 = randn(&randn_state);
      pdVar12[lVar14] = ABS(dVar3) * 2.220446049250313e-16 + dVar26;
    }
    puVar11 = (undefined8 *)operator_new__(uVar19);
    pdVar12 = (double *)operator_new__(uVar19);
    *puVar11 = 0x3ff0000000000000;
    dVar28 = dVar28 + dVar28;
    *pdVar12 = dVar28 + (1.0 - dVar28);
    for (lVar14 = 1; lVar14 <= forward_real_fft.fft_size / 2; lVar14 = lVar14 + 1) {
      dVar27 = (double)(int)lVar14 / dVar2;
      dVar26 = f0_00 * 3.141592653589793 * dVar27;
      dVar3 = sin(dVar26);
      puVar11[lVar14] = dVar3 / dVar26;
      dVar26 = cos(dVar27 * 6.283185307179586 * f0_00);
      pdVar12[lVar14] = dVar26 * dVar28 + (1.0 - dVar28);
    }
    for (uVar25 = 0; uVar13 != uVar25; uVar25 = uVar25 + 1) {
      dVar26 = log(forward_real_fft.waveform[uVar25]);
      forward_real_fft.waveform[uVar25] = dVar26;
    }
    pdVar16 = forward_real_fft.waveform + lVar22 + -1;
    for (lVar14 = 1; lVar14 < (long)uVar17; lVar14 = lVar14 + 1) {
      *pdVar16 = forward_real_fft.waveform[lVar14];
      pdVar16 = pdVar16 + -1;
    }
    pfVar18 = &forward_real_fft.forward_fft;
    puVar20 = (undefined8 *)&stack0xfffffffffffffdd8;
    for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar20 = *(undefined8 *)pfVar18;
      pfVar18 = (fft_plan *)((long)pfVar18 + (ulong)bVar24 * -0x10 + 8);
      puVar20 = puVar20 + (ulong)bVar24 * -2 + 1;
    }
    fft_execute(in_stack_fffffffffffffdd8);
    for (lVar14 = 0; uVar13 * 8 != lVar14; lVar14 = lVar14 + 8) {
      *(double *)((long)*inverse_real_fft.spectrum + lVar14 * 2) =
           (*(double *)((long)*forward_real_fft.spectrum + lVar14 * 2) *
            *(double *)((long)puVar11 + lVar14) * *(double *)((long)pdVar12 + lVar14)) /
           (double)fft_size;
      *(undefined8 *)((long)*inverse_real_fft.spectrum + lVar14 * 2 + 8) = 0;
    }
    pfVar18 = &inverse_real_fft.inverse_fft;
    puVar20 = (undefined8 *)&stack0xfffffffffffffdd8;
    for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar20 = *(undefined8 *)pfVar18;
      pfVar18 = (fft_plan *)((long)pfVar18 + (ulong)bVar24 * -0x10 + 8);
      puVar20 = puVar20 + (ulong)bVar24 * -2 + 1;
    }
    fft_execute(in_stack_fffffffffffffdd8);
    for (uVar25 = 0; uVar13 != uVar25; uVar25 = uVar25 + 1) {
      dVar26 = exp(inverse_real_fft.waveform[uVar25]);
      *(double *)((long)pvVar7 + uVar25 * 8) = dVar26;
    }
    operator_delete__(puVar11);
    operator_delete__(pdVar12);
    for (uVar25 = 0; uVar13 != uVar25; uVar25 = uVar25 + 1) {
      spectrogram[uVar21][uVar25] = *(double *)((long)pvVar7 + uVar25 * 8);
    }
  }
  DestroyForwardRealFFT(&forward_real_fft);
  DestroyInverseRealFFT(&inverse_real_fft);
  operator_delete__(pvVar7);
  return;
}

Assistant:

void CheapTrick(const double *x, int x_length, int fs,
    const double *temporal_positions, const double *f0, int f0_length,
    const CheapTrickOption *option, double **spectrogram) {
  int fft_size = option->fft_size;

  RandnState randn_state = {};
  randn_reseed(&randn_state);

  double f0_floor = GetF0FloorForCheapTrick(fs, fft_size);
  double *spectral_envelope = new double[fft_size];

  ForwardRealFFT forward_real_fft = {0};
  InitializeForwardRealFFT(fft_size, &forward_real_fft);
  InverseRealFFT inverse_real_fft = {0};
  InitializeInverseRealFFT(fft_size, &inverse_real_fft);

  double current_f0;
  for (int i = 0; i < f0_length; ++i) {
    current_f0 = f0[i] <= f0_floor ? world::kDefaultF0 : f0[i];
    CheapTrickGeneralBody(x, x_length, fs, current_f0, fft_size,
        temporal_positions[i], option->q1, &forward_real_fft,
        &inverse_real_fft, spectral_envelope, &randn_state);
    for (int j = 0; j <= fft_size / 2; ++j)
      spectrogram[i][j] = spectral_envelope[j];
  }

  DestroyForwardRealFFT(&forward_real_fft);
  DestroyInverseRealFFT(&inverse_real_fft);
  delete[] spectral_envelope;
}